

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

void cmsys::reginsert(char op,char *opnd)

{
  char *pcVar1;
  
  if (regcode != &regdummy) {
    pcVar1 = regcode;
    regcode = regcode + 3;
    for (; opnd < pcVar1; pcVar1 = pcVar1 + -1) {
      pcVar1[2] = pcVar1[-1];
    }
    *opnd = op;
    opnd[1] = '\0';
    opnd[2] = '\0';
    return;
  }
  regsize = regsize + 3;
  return;
}

Assistant:

static void reginsert(char op, char* opnd)
{
  char* src;
  char* dst;
  char* place;

  if (regcode == &regdummy) {
    regsize += 3;
    return;
  }

  src = regcode;
  regcode += 3;
  dst = regcode;
  while (src > opnd)
    *--dst = *--src;

  place = opnd; // Op node, where operand used to be.
  *place++ = op;
  *place++ = '\0';
  *place = '\0';
}